

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int32_t bam_aux2i(uint8_t *s)

{
  byte bVar1;
  int32_t iVar2;
  
  bVar1 = *s + 0xbd;
  switch(bVar1 * '\x10' | bVar1 >> 4) {
  case 0:
    return (int32_t)s[1];
  case 1:
    return (int32_t)*(ushort *)(s + 1);
  case 2:
    return (int)(char)s[1];
  case 3:
    return (int)*(short *)(s + 1);
  }
  iVar2 = 0;
  if ((*s & 0xdf) == 0x49) {
    iVar2 = *(int32_t *)(s + 1);
  }
  return iVar2;
}

Assistant:

int32_t bam_aux2i(const uint8_t *s)
{
    int type;
    type = *s++;
    if (type == 'c') return (int32_t)*(int8_t*)s;
    else if (type == 'C') return (int32_t)*(uint8_t*)s;
    else if (type == 's') return (int32_t)*(int16_t*)s;
    else if (type == 'S') return (int32_t)*(uint16_t*)s;
    else if (type == 'i' || type == 'I') return *(int32_t*)s;
    else return 0;
}